

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_memory_usage.cpp
# Opt level: O2

void kokkosp_deallocate_data(SpaceHandle space,char *label,void *ptr,uint64_t size)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 *__s1;
  ulong uVar6;
  double dVar7;
  tuple<double,_unsigned_long,_double> tStack_48;
  
  std::mutex::lock((mutex *)KokkosTools::MemoryUsage::m);
  dVar7 = Kokkos::Timer::seconds((Timer *)&KokkosTools::MemoryUsage::timer);
  uVar1 = KokkosTools::MemoryUsage::num_spaces;
  lVar3 = (long)(int)KokkosTools::MemoryUsage::num_spaces;
  uVar4 = 0;
  uVar6 = 0;
  if (0 < (int)KokkosTools::MemoryUsage::num_spaces) {
    uVar6 = (ulong)KokkosTools::MemoryUsage::num_spaces;
  }
  __s1 = KokkosTools::MemoryUsage::space_name;
  uVar5 = KokkosTools::MemoryUsage::num_spaces;
  for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    iVar2 = strcmp(__s1,space.name);
    if (iVar2 == 0) {
      uVar5 = (uint)uVar4;
    }
    __s1 = __s1 + 0x40;
  }
  if (uVar5 == uVar1) {
    strncpy(KokkosTools::MemoryUsage::space_name + lVar3 * 0x40,space.name,0x40);
    KokkosTools::MemoryUsage::num_spaces = uVar1 + 1;
  }
  lVar3 = (long)(int)uVar5;
  if (size <= (ulong)(&KokkosTools::MemoryUsage::space_size)[lVar3]) {
    (&KokkosTools::MemoryUsage::space_size)[lVar3] =
         (&KokkosTools::MemoryUsage::space_size)[lVar3] - size;
    tStack_48.super__Tuple_impl<0UL,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_unsigned_long,_double>.super__Tuple_impl<2UL,_double>.
    super__Head_base<2UL,_double,_false>._M_head_impl =
         (_Head_base<2UL,_double,_false>)KokkosTools::MemoryUsage::max_mem_usage();
    tStack_48.super__Tuple_impl<0UL,_double,_unsigned_long,_double>.
    super__Tuple_impl<1UL,_unsigned_long,_double>.super__Head_base<1UL,_unsigned_long,_false>.
    _M_head_impl = (&KokkosTools::MemoryUsage::space_size)[lVar3];
    tStack_48.super__Tuple_impl<0UL,_double,_unsigned_long,_double>.
    super__Head_base<0UL,_double,_false>._M_head_impl = dVar7;
    std::
    vector<std::tuple<double,unsigned_long,double>,std::allocator<std::tuple<double,unsigned_long,double>>>
    ::emplace_back<std::tuple<double,unsigned_long,double>>
              ((vector<std::tuple<double,unsigned_long,double>,std::allocator<std::tuple<double,unsigned_long,double>>>
                *)(KokkosTools::MemoryUsage::space_size_track + lVar3 * 0x18),&tStack_48);
  }
  pthread_mutex_unlock((pthread_mutex_t *)KokkosTools::MemoryUsage::m);
  return;
}

Assistant:

void kokkosp_deallocate_data(const SpaceHandle space, const char* /*label*/,
                             const void* const /*ptr*/, const uint64_t size) {
  std::lock_guard<std::mutex> lock(m);

  double time = timer.seconds();

  int space_i = num_spaces;
  for (int s = 0; s < num_spaces; s++)
    if (strcmp(space_name[s], space.name) == 0) space_i = s;

  if (space_i == num_spaces) {
    strncpy(space_name[num_spaces], space.name, 64);
    num_spaces++;
  }
  if (space_size[space_i] >= size) {
    space_size[space_i] -= size;
    space_size_track[space_i].push_back(
        std::make_tuple(time, space_size[space_i], max_mem_usage()));
  }
}